

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O2

_Bool gnode_is_equal(gnode_t *node1,gnode_t *node2)

{
  int iVar1;
  gnode_base_t *_node2;
  gnode_base_t *_node1;
  
  if ((node1->tag == NODE_LITERAL_EXPR) && (node2->tag == NODE_LITERAL_EXPR)) {
    if (node1[1].tag == node2[1].tag) {
      switch(node1[1].tag) {
      case NODE_LIST_STAT:
        iVar1 = strcmp(*(char **)&node1[1].block_length,*(char **)&node2[1].block_length);
        return iVar1 == 0;
      case NODE_COMPOUND_STAT:
        return (_Bool)(-(*(double *)&node2[1].block_length == *(double *)&node1[1].block_length) & 1
                      );
      case NODE_LABEL_STAT:
      case NODE_FLOW_STAT:
        return *(long *)&node1[1].block_length == *(long *)&node2[1].block_length;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool gnode_is_equal (gnode_t *node1, gnode_t *node2) {
    // very simple gnode verification for map key uniqueness
    gnode_base_t *_node1 = (gnode_base_t *)node1;
    gnode_base_t *_node2 = (gnode_base_t *)node2;
    if (_node1->base.tag != _node2->base.tag) return false;
    if (gnode_is_literal(node1)) {
        gnode_literal_expr_t *e1 = (gnode_literal_expr_t *)node1;
        gnode_literal_expr_t *e2 = (gnode_literal_expr_t *)node2;
        if (e1->type != e2->type) return false;
        // LITERAL_STRING, LITERAL_FLOAT, LITERAL_INT, LITERAL_BOOL, LITERAL_STRING_INTERPOLATED
        if (e1->type == LITERAL_BOOL) return (e1->value.n64 == e2->value.n64);
        if (e1->type == LITERAL_INT) return (e1->value.n64 == e2->value.n64);
        if (e1->type == LITERAL_FLOAT) return (e1->value.d == e2->value.d);
        if (e1->type == LITERAL_STRING) return (strcmp(e1->value.str, e2->value.str)==0);
        // there is no way to check node equality for a LITERAL_STRING_INTERPOLATED at compile time
    }
    return false;
}